

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level.cxx
# Opt level: O2

xr_image * load<xray_re::xr_image>(char *path,char *name,bool required)

{
  bool bVar1;
  xr_file_system *this;
  xr_image *this_00;
  
  this = xray_re::xr_file_system::instance();
  bVar1 = xray_re::xr_file_system::file_exist(this,path,name);
  if (bVar1) {
    xray_re::msg("loading %s",name);
    this_00 = (xr_image *)operator_new(0x18);
    this_00->_vptr_xr_image = (_func_int **)&PTR__xr_image_00238930;
    this_00->m_width = 0;
    this_00->m_height = 0;
    this_00->m_data = (rgba32 *)0x0;
    bVar1 = xray_re::xr_image::load_dds(this_00,path,name);
    if (!bVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level.cxx"
                    ,0x90,"xr_image *load(const char *, const char *, bool)");
    }
  }
  else {
    this_00 = (xr_image *)0x0;
  }
  return this_00;
}

Assistant:

xr_image* load(const char* path, const char* name, bool required)
{
	xr_file_system& fs = xr_file_system::instance();
	if (fs.file_exist(path, name)) {
		msg("loading %s", name);
		xr_image* image = new xr_image;
		if (!image->load_dds(path, name))
			xr_not_expected();
		return image;
	}
	return 0;
}